

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlDocDumpInternal(xmlOutputBufferPtr buf,xmlDocPtr doc,char *encoding,int format)

{
  int local_a4;
  undefined1 auStack_a0 [4];
  int options;
  xmlSaveCtxt ctxt;
  xmlChar *pxStack_20;
  int format_local;
  char *encoding_local;
  xmlDocPtr doc_local;
  xmlOutputBufferPtr buf_local;
  
  ctxt.escape._4_4_ = format;
  memset(auStack_a0,0,0x78);
  pxStack_20 = (xmlChar *)encoding;
  if (buf->encoder != (xmlCharEncodingHandlerPtr)0x0) {
    _auStack_a0 = (xmlChar *)buf->encoder->name;
    pxStack_20 = _auStack_a0;
  }
  local_a4 = 0x20;
  if (ctxt.escape._4_4_ != 0) {
    local_a4 = 0x21;
  }
  ctxt.handler = (xmlCharEncodingHandlerPtr)buf;
  xmlSaveCtxtInit((xmlSaveCtxtPtr)auStack_a0,local_a4);
  xmlSaveDocInternal((xmlSaveCtxtPtr)auStack_a0,doc,pxStack_20);
  return;
}

Assistant:

static void
xmlDocDumpInternal(xmlOutputBufferPtr buf, xmlDocPtr doc, const char *encoding,
                   int format) {
    xmlSaveCtxt ctxt;
    int options;

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;

    if (buf->encoder != NULL) {
        /*
         * Keep original encoding
         */
        encoding = buf->encoder->name;
        ctxt.encoding = BAD_CAST encoding;
    }

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

    xmlSaveDocInternal(&ctxt, doc, (const xmlChar *) encoding);
}